

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_set_cookie(http_s *h,http_cookie_args_s cookie)

{
  byte bVar1;
  http_cookie_args_s hVar2;
  FIOBJ o;
  FIOBJ FVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  FIOBJ name;
  ulong capa;
  long lVar7;
  fio_str_info_s t;
  fio_str_info_s local_48;
  
  hVar2 = cookie;
  if (h == (http_s *)0x0) {
    return -1;
  }
  if ((h->method == 0) && (h->status_str == 0)) {
    if (0x7fff < cookie.name_len || h->status != 0) {
      return -1;
    }
  }
  else if (0x7fff < cookie.name_len) {
    return -1;
  }
  if (cookie.value_len < 0x20000) {
    capa = cookie.value_len + cookie.name_len + 0x80;
    o = fiobj_str_buf(capa);
    fiobj_obj2cstr(&t,o);
    if (cookie.name == (char *)0x0) {
      lVar7 = 0;
    }
    else if (cookie.name_len == 0) {
      lVar7 = 0;
      lVar6 = 0;
      while( true ) {
        bVar1 = cookie.name[lVar6];
        if ((ulong)bVar1 == 0) break;
        if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [bVar1] == '\0') {
          t.data[lVar7] = bVar1;
          lVar7 = lVar7 + 1;
        }
        else {
          if ((http_set_cookie_warn_illegal == '\0') &&
             (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
            FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                           ,(ulong)(uint)(int)(char)bVar1,cookie.name);
          }
          t.data[lVar7] = '%';
          t.data[lVar7 + 1] = "0123456789ABCDEF"[(byte)cookie.name[lVar6] >> 4];
          t.data[lVar7 + 2] = "0123456789ABCDEF"[(byte)cookie.name[lVar6] & 0xf];
          lVar7 = lVar7 + 3;
        }
        lVar6 = lVar6 + 1;
        if (capa <= lVar7 + 3U) {
          capa = capa + 0x20;
          fiobj_str_capa_assert(o,capa);
          fiobj_obj2cstr(&local_48,o);
          t.data = local_48.data;
          t.capa = local_48.capa;
          t.len = local_48.len;
        }
      }
    }
    else {
      lVar7 = 0;
      sVar5 = 0;
      while (cookie.name_len != sVar5) {
        bVar1 = cookie.name[sVar5];
        if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [bVar1] == '\0') {
          t.data[lVar7] = bVar1;
          lVar7 = lVar7 + 1;
        }
        else {
          if ((http_set_cookie_warn_illegal == '\0') &&
             (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
            FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                           ,(ulong)(uint)(int)(char)bVar1,cookie.name);
          }
          t.data[lVar7] = '%';
          t.data[lVar7 + 1] = "0123456789ABCDEF"[(byte)cookie.name[sVar5] >> 4];
          t.data[lVar7 + 2] = "0123456789ABCDEF"[(byte)cookie.name[sVar5] & 0xf];
          lVar7 = lVar7 + 3;
        }
        sVar5 = sVar5 + 1;
        if (capa <= lVar7 + 3U) {
          capa = capa + 0x20;
          fiobj_str_capa_assert(o,capa);
          fiobj_obj2cstr(&local_48,o);
          t.data = local_48.data;
          t.capa = local_48.capa;
          t.len = local_48.len;
        }
      }
    }
    t.data[lVar7] = '=';
    lVar7 = lVar7 + 1;
    if (cookie.value == (char *)0x0) {
      cookie.max_age = -1;
    }
    else {
      sVar5 = 0;
      if (cookie.value_len == 0) {
        while( true ) {
          bVar1 = cookie.value[sVar5];
          if ((ulong)bVar1 == 0) break;
          if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              [bVar1] == '\0') {
            t.data[lVar7] = bVar1;
            lVar7 = lVar7 + 1;
          }
          else {
            if ((http_set_cookie_warn_illegal == '\0') &&
               (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
              FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                             ,(ulong)(uint)(int)(char)bVar1,cookie.value);
            }
            t.data[lVar7] = '%';
            t.data[lVar7 + 1] = "0123456789ABCDEF"[(byte)cookie.value[sVar5] >> 4];
            t.data[lVar7 + 2] = "0123456789ABCDEF"[(byte)cookie.value[sVar5] & 0xf];
            lVar7 = lVar7 + 3;
          }
          sVar5 = sVar5 + 1;
          if (capa <= lVar7 + 3U) {
            capa = capa + 0x20;
            fiobj_str_capa_assert(o,capa);
            fiobj_obj2cstr(&local_48,o);
            t.data = local_48.data;
            t.capa = local_48.capa;
            t.len = local_48.len;
          }
        }
      }
      else {
        while (cookie.value_len != sVar5) {
          bVar1 = cookie.value[sVar5];
          if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              [bVar1] == '\0') {
            t.data[lVar7] = bVar1;
            lVar7 = lVar7 + 1;
          }
          else {
            if ((http_set_cookie_warn_illegal == '\0') &&
               (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
              FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                             ,(ulong)(uint)(int)(char)bVar1,cookie.value);
            }
            t.data[lVar7] = '%';
            t.data[lVar7 + 1] = "0123456789ABCDEF"[(byte)cookie.value[sVar5] >> 4];
            t.data[lVar7 + 2] = "0123456789ABCDEF"[(byte)cookie.value[sVar5] & 0xf];
            lVar7 = lVar7 + 3;
          }
          sVar5 = sVar5 + 1;
          if (capa <= lVar7 + 3U) {
            capa = capa + 0x20;
            fiobj_str_capa_assert(o,capa);
            fiobj_obj2cstr(&local_48,o);
            t.data = local_48.data;
            t.capa = local_48.capa;
            t.len = local_48.len;
          }
        }
      }
    }
    lVar6 = *(long *)((h->private_data).flag + 0x38);
    if ((lVar6 == 0) || (*(char *)(lVar6 + 0x7b) == '\0')) {
      t.data[lVar7] = ';';
      t.data[lVar7 + 1] = ' ';
      if ((h->status_str == 0) && (h->status != 0)) {
        if (capa <= lVar7 + 0x2aU) {
          fiobj_str_capa_assert(o,lVar7 + 0x2aU);
          fiobj_obj2cstr(&local_48,o);
          t.data = local_48.data;
          t.capa = local_48.capa;
          t.len = local_48.len;
        }
        if ((long)cookie.max_age == 0) {
          sVar5 = lVar7 + 2;
        }
        else {
          builtin_strncpy(t.data + lVar7 + 2,"Max-Age=",8);
          sVar4 = fio_ltoa(t.data + lVar7 + 10,(long)cookie.max_age,'\n');
          t.data[sVar4 + lVar7 + 10] = ';';
          sVar5 = lVar7 + sVar4 + 0xc;
          t.data[sVar4 + lVar7 + 0xb] = ' ';
        }
        fiobj_str_resize(o,sVar5);
        if (cookie.domain_len != 0 && cookie.domain != (char *)0x0) {
          fiobj_str_write(o,"domain=",7);
          fiobj_str_write(o,cookie.domain,cookie.domain_len);
          fiobj_str_write(o,";",1);
          t.data[sVar5] = ' ';
          sVar5 = sVar5 + 1;
        }
        if (cookie.path_len != 0 && cookie.path != (char *)0x0) {
          fiobj_str_write(o,"path=",5);
          fiobj_str_write(o,cookie.path,cookie.path_len);
          fiobj_str_write(o,";",1);
          t.data[sVar5] = ' ';
        }
        if (((undefined1  [72])hVar2 & (undefined1  [72])0x200000000) != (undefined1  [72])0x0) {
          fiobj_str_write(o,"HttpOnly;",9);
        }
        if (((undefined1  [72])hVar2 & (undefined1  [72])0x100000000) != (undefined1  [72])0x0) {
          fiobj_str_write(o,"secure;",7);
        }
        FVar3 = (h->private_data).out_headers;
        name = HTTP_HEADER_SET_COOKIE;
      }
      else {
        if (http_set_cookie::cookie_hash == 0) {
          http_set_cookie::cookie_hash = fiobj_hash_string("cookie",6);
        }
        FVar3 = fiobj_hash_get2((h->private_data).out_headers,http_set_cookie::cookie_hash);
        if (FVar3 != 0) {
          fiobj_str_concat(FVar3,o);
          fiobj_free(o);
          return 0;
        }
        FVar3 = (h->private_data).out_headers;
        name = HTTP_HEADER_COOKIE;
      }
    }
    else {
      if (cookie.value == (char *)0x0) {
        fiobj_free(o);
        return -1;
      }
      FVar3 = (h->private_data).out_headers;
      name = HTTP_HEADER_COOKIE;
    }
    set_header_add(FVar3,name,o);
    return 0;
  }
  return -1;
}

Assistant:

int http_set_cookie(http_s *h, http_cookie_args_s cookie) {
#if DEBUG
  FIO_ASSERT(h, "Can't set cookie for NULL HTTP handler!");
#endif
  if (HTTP_INVALID_HANDLE(h) || cookie.name_len >= 32768 ||
      cookie.value_len >= 131072) {
    return -1;
  }

  static int warn_illegal = 0;

  /* write name and value while auto-correcting encoding issues */
  size_t capa = cookie.name_len + cookie.value_len + 128;
  size_t len = 0;
  FIOBJ c = fiobj_str_buf(capa);
  fio_str_info_s t = fiobj_obj2cstr(c);

#define copy_cookie_ch(ch_var)                                                 \
  if (invalid_cookie_##ch_var##_char[(uint8_t)cookie.ch_var[tmp]]) {           \
    if (!warn_illegal) {                                                       \
      ++warn_illegal;                                                          \
      FIO_LOG_WARNING("illegal char 0x%.2x in cookie " #ch_var " (in %s)\n"    \
                      "         automatic %% encoding applied",                \
                      cookie.ch_var[tmp], cookie.ch_var);                      \
    }                                                                          \
    t.data[len++] = '%';                                                       \
    t.data[len++] = hex_chars[((uint8_t)cookie.ch_var[tmp] >> 4) & 0x0F];      \
    t.data[len++] = hex_chars[(uint8_t)cookie.ch_var[tmp] & 0x0F];             \
  } else {                                                                     \
    t.data[len++] = cookie.ch_var[tmp];                                        \
  }                                                                            \
  tmp += 1;                                                                    \
  if (capa <= len + 3) {                                                       \
    capa += 32;                                                                \
    fiobj_str_capa_assert(c, capa);                                            \
    t = fiobj_obj2cstr(c);                                                     \
  }

  if (cookie.name) {
    size_t tmp = 0;
    if (cookie.name_len) {
      while (tmp < cookie.name_len) {
        copy_cookie_ch(name);
      }
    } else {
      while (cookie.name[tmp]) {
        copy_cookie_ch(name);
      }
    }
  }
  t.data[len++] = '=';
  if (cookie.value) {
    size_t tmp = 0;
    if (cookie.value_len) {
      while (tmp < cookie.value_len) {
        copy_cookie_ch(value);
      }
    } else {
      while (cookie.value[tmp]) {
        copy_cookie_ch(value);
      }
    }
  } else
    cookie.max_age = -1;

  if (http_settings(h) && http_settings(h)->is_client) {
    if (!cookie.value) {
      fiobj_free(c);
      return -1;
    }
    set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    return 0;
  }

  t.data[len++] = ';';
  t.data[len++] = ' ';

  if (h->status_str || !h->status) { /* on first request status == 0 */
    static uint64_t cookie_hash;
    if (!cookie_hash)
      cookie_hash = fiobj_hash_string("cookie", 6);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, cookie_hash);
    if (!tmp) {
      set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    } else {
      fiobj_str_join(tmp, c);
      fiobj_free(c);
    }
    return 0;
  }

  if (capa <= len + 40) {
    capa = len + 40;
    fiobj_str_capa_assert(c, capa);
    t = fiobj_obj2cstr(c);
  }
  if (cookie.max_age) {
    memcpy(t.data + len, "Max-Age=", 8);
    len += 8;
    len += fio_ltoa(t.data + len, cookie.max_age, 10);
    t.data[len++] = ';';
    t.data[len++] = ' ';
  }
  fiobj_str_resize(c, len);

  if (cookie.domain && cookie.domain_len) {
    fiobj_str_write(c, "domain=", 7);
    fiobj_str_write(c, cookie.domain, cookie.domain_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.path && cookie.path_len) {
    fiobj_str_write(c, "path=", 5);
    fiobj_str_write(c, cookie.path, cookie.path_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.http_only) {
    fiobj_str_write(c, "HttpOnly;", 9);
  }
  if (cookie.secure) {
    fiobj_str_write(c, "secure;", 7);
  }
  set_header_add(h->private_data.out_headers, HTTP_HEADER_SET_COOKIE, c);
  return 0;
}